

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_1::PosixEnv::BackgroundThreadMain(PosixEnv *this)

{
  _func_void_void_ptr *p_Var1;
  bool bVar2;
  reference pvVar3;
  void *background_work_arg;
  _func_void_void_ptr *background_work_function;
  queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
  *in_stack_ffffffffffffffd8;
  CondVar *in_stack_ffffffffffffffe8;
  
  while( true ) {
    port::Mutex::Lock((Mutex *)in_stack_ffffffffffffffd8);
    while( true ) {
      bVar2 = std::
              queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
              ::empty(in_stack_ffffffffffffffd8);
      if (!bVar2) break;
      port::CondVar::Wait(in_stack_ffffffffffffffe8);
    }
    bVar2 = std::
            queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
            ::empty(in_stack_ffffffffffffffd8);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::
             queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
             ::front(in_stack_ffffffffffffffd8);
    p_Var1 = pvVar3->function;
    pvVar3 = std::
             queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
             ::front(in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe8 = (CondVar *)pvVar3->arg;
    std::
    queue<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::deque<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem,_std::allocator<leveldb::(anonymous_namespace)::PosixEnv::BackgroundWorkItem>_>_>
    ::pop(in_stack_ffffffffffffffd8);
    port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffffd8);
    (*p_Var1)(in_stack_ffffffffffffffe8);
  }
  __assert_fail("!background_work_queue_.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/env_posix.cc"
                ,0x338,"void leveldb::(anonymous namespace)::PosixEnv::BackgroundThreadMain()");
}

Assistant:

void PosixEnv::BackgroundThreadMain() {
  while (true) {
    background_work_mutex_.Lock();

    // Wait until there is work to be done.
    while (background_work_queue_.empty()) {
      background_work_cv_.Wait();
    }

    assert(!background_work_queue_.empty());
    auto background_work_function = background_work_queue_.front().function;
    void* background_work_arg = background_work_queue_.front().arg;
    background_work_queue_.pop();

    background_work_mutex_.Unlock();
    background_work_function(background_work_arg);
  }
}